

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O2

void __thiscall wabt::BinaryReaderLogging::LogType(BinaryReaderLogging *this,Type type)

{
  Stream *this_00;
  char *pcVar1;
  
  this_00 = this->stream_;
  if (I32 < type) {
    Stream::Writef(this_00,"funcidx[%d]");
    return;
  }
  pcVar1 = GetTypeName(type);
  Stream::Writef(this_00,"%s",pcVar1);
  return;
}

Assistant:

void BinaryReaderLogging::LogType(Type type) {
  if (IsTypeIndex(type)) {
    LOGF_NOINDENT("funcidx[%d]", static_cast<int>(type));
  } else {
    LOGF_NOINDENT("%s", GetTypeName(type));
  }
}